

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CADFile.cpp
# Opt level: O0

bool CADFile::verifyFormat(vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  bool local_7a;
  allocator<char> local_69;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_31;
  string local_30 [47];
  bool local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (allocator<char> *)in_stack_ffffffffffffffa0);
  bVar1 = find_str_in_buf(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_7a = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (allocator<char> *)in_stack_ffffffffffffffa0);
    local_7a = find_str_in_buf(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  local_1 = local_7a;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator(&local_69);
  }
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return (bool)(local_1 & 1);
}

Assistant:

bool CADFile::verifyFormat(std::vector<char> &buf) {
	return (find_str_in_buf("###Panel Added", buf) && find_str_in_buf("C_PIN", buf));
}